

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O2

void __thiscall cplus::lang::ByteArray::setSize(ByteArray *this,size_t size)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  size_t index;
  ulong uVar4;
  
  if (this->bufferSize <= size) {
    pcVar2 = (char *)operator_new__(size);
    pcVar1 = this->buffer;
    uVar3 = this->size;
    if (size <= this->size) {
      uVar3 = size;
    }
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pcVar2[uVar4] = pcVar1[uVar4];
    }
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
    }
    this->buffer = pcVar2;
    this->bufferSize = size;
  }
  this->size = size;
  return;
}

Assistant:

void ByteArray::setSize(size_t size) {
			if (size < bufferSize) {
				this->size = size;
			} else {
				auto newBuffer = new char[size];
				auto minSize = (size < this->size) ? size : this->size;
				for (size_t index = 0; index < minSize; index++) {
					newBuffer[index] = buffer[index];
				}
				delete[] buffer;
				buffer = newBuffer;
				bufferSize = size;
				ByteArray::size = size;
			}
		}